

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Object_State_Header::Object_State_Header(Object_State_Header *this,Header *H)

{
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Object_State_Header_00215c28;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ObjID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RefObjID);
  this->m_ui16UpdateNum = 0;
  this->m_ui8ForceID = '\0';
  return;
}

Assistant:

Object_State_Header::Object_State_Header( const Header & H ) :
    Header( H ),
    m_ui16UpdateNum( 0 ),
    m_ui8ForceID( 0 )
{
}